

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O0

pair<unsigned_long,_robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::InsertionState>
 __thiscall
robin_hood::detail::
Table<true,80ul,std::__cxx11::string,int,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
::insertKeyPrepareEmptySpot<std::__cxx11::string&>
          (Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  InfoType IVar1;
  size_t sVar2;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  pair<unsigned_long,_robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::InsertionState>
  pVar4;
  InfoType insertion_info;
  size_t insertion_idx;
  InfoType info;
  size_t idx;
  int i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff70;
  uint8_t local_74;
  InfoType local_34;
  size_t local_30;
  int local_24;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  unsigned_long local_10;
  InsertionState local_8;
  
  local_24 = 0;
  local_20 = in_RSI;
  do {
    if (0xff < local_24) {
      pVar4 = std::
              make_pair<unsigned_long,robin_hood::detail::Table<true,80ul,std::__cxx11::string,int,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>::InsertionState>
                        (&in_RDI->mHashMultiplier,(InsertionState *)in_stack_ffffffffffffff48);
      local_10 = pVar4.first;
      local_8 = pVar4.second;
LAB_0015dc40:
      pVar4.second = local_8;
      pVar4.first = local_10;
      pVar4._12_4_ = 0;
      return pVar4;
    }
    local_30 = 0;
    local_34 = 0;
    keyToIdx<std::__cxx11::string&>
              (in_stack_ffffffffffffff70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
               (size_t *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               (InfoType *)in_stack_ffffffffffffff58);
    Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::nextWhileLess((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                    (InfoType *)in_stack_ffffffffffffff58,&in_RDI->mHashMultiplier);
    while (sVar2 = local_30, IVar1 = local_34, local_34 == in_RDI->mInfo[local_30]) {
      in_stack_ffffffffffffff48 = local_20;
      DataNode<robin_hood::detail::Table<true,80ul,std::__cxx11::string,int,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>,true>
      ::getFirst<robin_hood::pair<std::__cxx11::string,int>>
                ((DataNode<robin_hood::detail::Table<true,80ul,std::__cxx11::string,int,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>,true>
                  *)(in_RDI->mKeyVals + local_30));
      bVar3 = std::
              equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_RDI,in_stack_ffffffffffffff48,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           0x15da0e);
      if (bVar3) {
        pVar4 = std::
                make_pair<unsigned_long&,robin_hood::detail::Table<true,80ul,std::__cxx11::string,int,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>::InsertionState>
                          (&in_RDI->mHashMultiplier,(InsertionState *)in_stack_ffffffffffffff48);
        local_10 = pVar4.first;
        local_8 = pVar4.second;
        goto LAB_0015dc40;
      }
      Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::next(in_RDI,&local_34,&local_30);
    }
    if (in_RDI->mNumElements < in_RDI->mMaxNumElementsAllowed) {
      if (0xff < local_34 + in_RDI->mInfoInc) {
        in_RDI->mMaxNumElementsAllowed = 0;
      }
      while (in_RDI->mInfo[local_30] != '\0') {
        Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::next(in_RDI,&local_34,&local_30);
      }
      if (local_30 != sVar2) {
        Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::shiftUp((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                  (size_t)in_stack_ffffffffffffff58,(size_t)in_RDI);
      }
      local_74 = (uint8_t)IVar1;
      in_RDI->mInfo[sVar2] = local_74;
      in_RDI->mNumElements = in_RDI->mNumElements + 1;
      pVar4 = std::
              make_pair<unsigned_long_const&,robin_hood::detail::Table<true,80ul,std::__cxx11::string,int,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>::InsertionState>
                        (&in_RDI->mHashMultiplier,(InsertionState *)in_stack_ffffffffffffff48);
      local_10 = pVar4.first;
      local_8 = pVar4.second;
      goto LAB_0015dc40;
    }
    bVar3 = Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::increase_size(in_stack_ffffffffffffff58);
    if (!bVar3) {
      pVar4 = std::
              make_pair<unsigned_long,robin_hood::detail::Table<true,80ul,std::__cxx11::string,int,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>::InsertionState>
                        (&in_RDI->mHashMultiplier,(InsertionState *)in_stack_ffffffffffffff48);
      local_10 = pVar4.first;
      local_8 = pVar4.second;
      goto LAB_0015dc40;
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

std::pair<size_t, InsertionState> insertKeyPrepareEmptySpot(OtherKey&& key) {
        for (int i = 0; i < 256; ++i) {
            size_t idx{};
            InfoType info{};
            keyToIdx(key, &idx, &info);
            nextWhileLess(&info, &idx);

            // while we potentially have a match
            while (info == mInfo[idx]) {
                if (WKeyEqual::operator()(key, mKeyVals[idx].getFirst())) {
                    // key already exists, do NOT insert.
                    // see http://en.cppreference.com/w/cpp/container/unordered_map/insert
                    return std::make_pair(idx, InsertionState::key_found);
                }
                next(&info, &idx);
            }

            // unlikely that this evaluates to true
            if (ROBIN_HOOD_UNLIKELY(mNumElements >= mMaxNumElementsAllowed)) {
                if (!increase_size()) {
                    return std::make_pair(size_t(0), InsertionState::overflow_error);
                }
                continue;
            }

            // key not found, so we are now exactly where we want to insert it.
            auto const insertion_idx = idx;
            auto const insertion_info = info;
            if (ROBIN_HOOD_UNLIKELY(insertion_info + mInfoInc > 0xFF)) {
                mMaxNumElementsAllowed = 0;
            }

            // find an empty spot
            while (0 != mInfo[idx]) {
                next(&info, &idx);
            }

            if (idx != insertion_idx) {
                shiftUp(idx, insertion_idx);
            }
            // put at empty spot
            mInfo[insertion_idx] = static_cast<uint8_t>(insertion_info);
            ++mNumElements;
            return std::make_pair(insertion_idx, idx == insertion_idx
                                                     ? InsertionState::new_node
                                                     : InsertionState::overwrite_node);
        }

        // enough attempts failed, so finally give up.
        return std::make_pair(size_t(0), InsertionState::overflow_error);
    }